

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsItem::childItems(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsItem *this)

{
  QGraphicsItemPrivate::ensureSortedChildren((this->d_ptr).d);
  QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(((this->d_ptr).d)->children).d);
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsItem::childItems() const
{
    const_cast<QGraphicsItem *>(this)->d_ptr->ensureSortedChildren();
    return d_ptr->children;
}